

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

bool __thiscall dxil_spv::CFGNode::can_loop_merge_to(CFGNode *this,CFGNode *other)

{
  CFGNode *pCVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  bool bVar4;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  _Var5;
  CFGNode *local_10;
  
  local_10 = other;
  bVar4 = dominates(this,other);
  if (bVar4) {
    pCVar1 = this->pred_back_edge;
    if (pCVar1 != (CFGNode *)0x0) {
      ppCVar2 = (pCVar1->succ).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppCVar3 = (pCVar1->succ).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppCVar2 != ppCVar3) {
        _Var5 = std::
                __find_if<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_equals_val<dxil_spv::CFGNode_const*const>>
                          (ppCVar2,ppCVar3,&local_10);
        if (_Var5._M_current ==
            (pCVar1->succ).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0013fb30;
      }
    }
    bVar4 = true;
  }
  else {
LAB_0013fb30:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool CFGNode::can_loop_merge_to(const CFGNode *other) const
{
	if (!dominates(other))
		return false;

	auto *c = pred_back_edge;

	if (c && !c->succ.empty())
	{
		// If the continue block branches to something which is not the loop header,
		// it must be the merge block we're after, i.e., it must be a clean break (or we are kind of screwed).
		// Detect a "fake" merge branch here.
		// E.g., we have a fake merge branch if an escaping edge is branching to one block beyond the real merge block.
		// This can happen after split_merge_scopes() transform where inner loop
		// tries to break out of multiple loops and multiple selection scopes at the same time.
		// We can still dominate this escape target, but it's still an escape which must be resolved some other way with ladders.
		if (std::find(c->succ.begin(), c->succ.end(), other) == c->succ.end())
			return false;
	}

	return true;
}